

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PredicateSplitPassiveClauseContainers.cpp
# Opt level: O0

uint __thiscall
Saturation::PredicateSplitPassiveClauseContainer::bestQueue
          (PredicateSplitPassiveClauseContainer *this,float featureValue)

{
  size_type sVar1;
  const_reference pvVar2;
  Clause *pCVar3;
  pointer pPVar4;
  vector<float,_std::allocator<float>_> *extraout_RAX;
  PredicateSplitPassiveClauseContainer *in_RSI;
  long in_RDI;
  vector<float,_std::allocator<float>_> *this_00;
  float in_XMM0_Da;
  uint i;
  Clause *in_stack_ffffffffffffffb0;
  uint uStack_40;
  float in_stack_ffffffffffffffc4;
  uint local_10;
  
  local_10 = 0;
  while( true ) {
    this_00 = (vector<float,_std::allocator<float>_> *)(in_RDI + 0x98);
    sVar1 = std::vector<float,_std::allocator<float>_>::size(this_00);
    if (sVar1 <= local_10) {
      (**(code **)((this_00->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                   super__Vector_impl_data._M_start + 0x28))(this_00,in_RSI);
      uStack_40 = bestQueue(in_RSI,in_stack_ffffffffffffffc4);
      if (((ulong)this_00[9].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_finish & 1) == 0) {
        std::
        vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
        ::operator[]((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                      *)&this_00[5].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,(ulong)uStack_40);
        pPVar4 = std::
                 unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                 ::operator->((unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                               *)0xac96bc);
        (*(pPVar4->super_RandomAccessClauseContainer).super_ClauseContainer._vptr_ClauseContainer[2]
        )(pPVar4,in_RSI);
      }
      else {
        while( true ) {
          in_stack_ffffffffffffffb0 = (Clause *)(ulong)uStack_40;
          pCVar3 = (Clause *)
                   std::
                   vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                   ::size((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                           *)&this_00[5].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_finish);
          if (pCVar3 <= in_stack_ffffffffffffffb0) break;
          std::
          vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
          ::operator[]((vector<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>,_std::allocator<std::unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>_>_>
                        *)&this_00[5].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish,(ulong)uStack_40);
          pPVar4 = std::
                   unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                   ::operator->((unique_ptr<Saturation::PassiveClauseContainer,_std::default_delete<Saturation::PassiveClauseContainer>_>
                                 *)0xac9680);
          (*(pPVar4->super_RandomAccessClauseContainer).super_ClauseContainer._vptr_ClauseContainer
            [2])(pPVar4,in_RSI);
          uStack_40 = uStack_40 + 1;
        }
      }
      if (((ulong)this_00[1].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage & 1) != 0) {
        Lib::SingleParamEvent<Kernel::Clause_*>::fire
                  ((SingleParamEvent<Kernel::Clause_*> *)this_00,in_stack_ffffffffffffffb0);
        this_00 = extraout_RAX;
      }
      return (uint)this_00;
    }
    in_RSI = (PredicateSplitPassiveClauseContainer *)(ulong)local_10;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 0x98),(size_type)in_RSI);
    if (in_XMM0_Da <= *pvVar2) break;
    local_10 = local_10 + 1;
  }
  return local_10;
}

Assistant:

unsigned PredicateSplitPassiveClauseContainer::bestQueue(float featureValue) const
{
  // compute best queue clause should be placed in
  ASS(_cutoffs.back() == std::numeric_limits<float>::max());
  for (unsigned i = 0; i < _cutoffs.size(); i++)
  {
    if (featureValue <= _cutoffs[i])
    {
      return i;
    }
  }
  // unreachable
  ASSERTION_VIOLATION;
}